

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::MinInAnArray(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Var aValue;
  JavascriptNativeArray *this;
  TypedArrayBase *this_00;
  Var pvVar8;
  RecyclableObject *this_01;
  JavascriptArray *pJVar9;
  Type typeId;
  ThreadContext *pTVar10;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x49f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00993d61;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_50._0_4_ & 0xffffff) != 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x4a0,"(args.Info.Count == 2)","args.Info.Count == 2");
    if (!bVar4) goto LAB_00993d61;
    *puVar6 = 0;
  }
  pvVar7 = Arguments::operator[]((Arguments *)local_50,0);
  aValue = Arguments::operator[]((Arguments *)local_50,1);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00993d61;
    *puVar6 = 0;
  }
  bVar4 = TaggedInt::Is(aValue);
  if (bVar4) {
    typeId = TypeIds_FirstNumberType;
  }
  else if ((ulong)aValue >> 0x32 == 0) {
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00993d61;
      *puVar6 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar5 = RecyclableObject::IsExternal(this_01), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_00993d61:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  else {
    typeId = TypeIds_Number;
  }
  bVar4 = JavascriptNativeArray::Is(typeId);
  if ((bVar4) ||
     ((BVar5 = TypedArrayBase::Is(typeId), typeId - TypeIds_EngineInterfaceObject < 0xfffffffe &&
      (BVar5 != 0)))) {
    bVar4 = JavascriptNativeArray::Is(typeId);
    if (bVar4) {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(aValue);
      this = UnsafeVarTo<Js::JavascriptNativeArray>(aValue);
      TVar1 = (this->super_JavascriptArray).super_ArrayObject.length;
      if (TVar1 == 0) {
LAB_00993d14:
        return (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               positiveInfinite.ptr;
      }
      if ((((((this->super_JavascriptArray).head.ptr)->next).ptr == (SparseArraySegmentBase *)0x0)
          && (bVar4 = JavascriptArray::HasNoMissingValues(&this->super_JavascriptArray), bVar4)) &&
         (((this->super_JavascriptArray).head.ptr)->length == TVar1)) {
        pvVar7 = JavascriptNativeArray::FindMinOrMax(this,pSVar2,false);
        return pvVar7;
      }
      pTVar10 = pSVar2->threadContext;
      bVar4 = pTVar10->reentrancySafeOrHandled;
      pTVar10->reentrancySafeOrHandled = true;
      pvVar7 = JavascriptFunction::CalloutHelper<false>(function,pvVar7,(Var)0x0,aValue,pSVar2);
    }
    else {
      this_00 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
      if ((this_00->super_ArrayBufferParent).super_ArrayObject.length == 0) goto LAB_00993d14;
      pvVar8 = TypedArrayBase::FindMinOrMax(this_00,pSVar2,typeId,false);
      if (pvVar8 != (Var)0x0) {
        return pvVar8;
      }
      pTVar10 = pSVar2->threadContext;
      bVar4 = pTVar10->reentrancySafeOrHandled;
      pTVar10->reentrancySafeOrHandled = true;
      pvVar7 = JavascriptFunction::CalloutHelper<false>(function,pvVar7,(Var)0x0,aValue,pSVar2);
    }
  }
  else {
    bVar4 = JavascriptArray::IsNonES5Array(typeId);
    if ((bVar4) &&
       (pJVar9 = UnsafeVarTo<Js::JavascriptArray>(aValue), (pJVar9->super_ArrayObject).length == 0))
    goto LAB_00993d14;
    pTVar10 = pSVar2->threadContext;
    bVar4 = pTVar10->reentrancySafeOrHandled;
    pTVar10->reentrancySafeOrHandled = true;
    pvVar7 = JavascriptFunction::CalloutHelper<false>(function,pvVar7,(Var)0x0,aValue,pSVar2);
  }
  pTVar10->reentrancySafeOrHandled = bVar4;
  return pvVar7;
}

Assistant:

Var JavascriptMath::MinInAnArray(RecyclableObject * function, CallInfo callInfo, ...)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MinInAnArray);
            PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

            ARGUMENTS(args, callInfo);
            Assert(args.Info.Count == 2);
            Var thisArg = args[0];
            Var arrayArg = args[1];

            ScriptContext * scriptContext = function->GetScriptContext();

            TypeId typeId = JavascriptOperators::GetTypeId(arrayArg);
            if (!JavascriptNativeArray::Is(typeId) && !(TypedArrayBase::Is(typeId) && typeId != TypeIds_CharArray && typeId != TypeIds_BoolArray))
            {
                if (JavascriptArray::IsNonES5Array(typeId) && UnsafeVarTo<JavascriptArray>(arrayArg)->GetLength() == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }

            if (JavascriptNativeArray::Is(typeId))
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayArg);
#endif
                JavascriptNativeArray * argsArray = UnsafeVarTo<JavascriptNativeArray>(arrayArg);
                uint len = argsArray->GetLength();
                if (len == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }

                if (argsArray->GetHead()->next != nullptr || !argsArray->HasNoMissingValues() ||
                    argsArray->GetHead()->length != len)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                return argsArray->FindMinOrMax(scriptContext, false /*findMax*/);
            }
            else
            {
                TypedArrayBase * argsArray = UnsafeVarTo<TypedArrayBase>(arrayArg);
                uint len = argsArray->GetLength();
                if (len == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }
                Var min = argsArray->FindMinOrMax(scriptContext, typeId, false /*findMax*/);
                if (min == nullptr)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
                return min;
            }
            JIT_HELPER_END(Op_MinInAnArray);
        }